

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O0

double __thiscall prometheus::detail::CKMSQuantiles::get(CKMSQuantiles *this,double q)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  int rank;
  pointer pIVar4;
  reference pvVar5;
  double dVar6;
  undefined1 auVar7 [16];
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  local_50;
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  local_48;
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  cur;
  iterator prev;
  iterator it;
  double bound;
  int desired;
  int rankMin;
  double q_local;
  CKMSQuantiles *this_local;
  
  insertBatch(this);
  compress(this);
  bVar3 = std::
          vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
          ::empty(&this->sample_);
  if (bVar3) {
    this_local = (CKMSQuantiles *)std::numeric_limits<double>::quiet_NaN();
  }
  else {
    bound._4_4_ = 0;
    sVar1 = this->count_;
    auVar7._8_4_ = (int)(sVar1 >> 0x20);
    auVar7._0_8_ = sVar1;
    auVar7._12_4_ = 0x45300000;
    rank = (int)(q * ((auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)));
    dVar6 = allowableError(this,rank);
    prev = std::
           vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
           ::begin(&this->sample_);
    __gnu_cxx::
    __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
    ::__normal_iterator(&cur);
    local_48 = __gnu_cxx::
               __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
               ::operator++(&prev,0);
    do {
      local_50._M_current =
           (Item *)std::
                   vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                   ::end(&this->sample_);
      bVar3 = __gnu_cxx::operator!=(&prev,&local_50);
      if (!bVar3) {
        pvVar5 = std::
                 vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 ::back(&this->sample_);
        return pvVar5->value;
      }
      cur._M_current = local_48._M_current;
      local_48 = __gnu_cxx::
                 __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
                 ::operator++(&prev,0);
      pIVar4 = __gnu_cxx::
               __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
               ::operator->(&cur);
      bound._4_4_ = pIVar4->g + bound._4_4_;
      pIVar4 = __gnu_cxx::
               __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
               ::operator->(&local_48);
      iVar2 = pIVar4->g;
      pIVar4 = __gnu_cxx::
               __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
               ::operator->(&local_48);
    } while ((double)(bound._4_4_ + iVar2 + pIVar4->delta) <= (double)rank + dVar6 / 2.0);
    pIVar4 = __gnu_cxx::
             __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
             ::operator->(&cur);
    this_local = (CKMSQuantiles *)pIVar4->value;
  }
  return (double)this_local;
}

Assistant:

double CKMSQuantiles::get(double q) {
  insertBatch();
  compress();

  if (sample_.empty()) {
    return std::numeric_limits<double>::quiet_NaN();
  }

  int rankMin = 0;
  const auto desired = static_cast<int>(q * count_);
  const auto bound = desired + (allowableError(desired) / 2);

  auto it = sample_.begin();
  decltype(it) prev;
  auto cur = it++;

  while (it != sample_.end()) {
    prev = cur;
    cur = it++;

    rankMin += prev->g;

    if (rankMin + cur->g + cur->delta > bound) {
      return prev->value;
    }
  }

  return sample_.back().value;
}